

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O2

void __thiscall
cxxopts::values::standard_value<bool>::standard_value(standard_value<bool> *this,bool *b)

{
  abstract_value<bool>::abstract_value(&this->super_abstract_value<bool>,b);
  (this->super_abstract_value<bool>).super_Value._vptr_Value =
       (_func_int **)&PTR__abstract_value_0016e058;
  set_default_and_implicit(this);
  return;
}

Assistant:

explicit standard_value(bool* b)
      : abstract_value(b)
      {
        set_default_and_implicit();
      }